

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_finalize_port(sexp ctx,sexp self,sexp_sint_t n,sexp port)

{
  sexp *ppsVar1;
  sexp psVar2;
  sexp __stream;
  int iVar3;
  
  if ((port->value).flonum_bits[0x28] != '\0') {
    (port->value).flonum_bits[0x28] = '\0';
    if ((((ulong)port & 3) == 0) && (port->tag == 0x11)) {
      if ((port->value).type.setters == (sexp)0x0) {
        fflush((FILE *)(port->value).type.getters);
      }
      else {
        sexp_buffered_flush(ctx,port,1);
      }
    }
    psVar2 = (port->value).type.slots;
    if (((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x12)) &&
       ((psVar2->value).flonum_bits[0] != '\0')) {
      if ((((ulong)port & 3) == 0) && ((port->value).flonum_bits[0x2b] != '\0')) {
        if (port->tag == 0x10) {
          __stream = (port->value).type.getters;
          if (__stream == (sexp)0x0) {
            iVar3 = (psVar2->value).promise.donep;
          }
          else {
            iVar3 = fileno((FILE *)__stream);
          }
          shutdown(iVar3,(uint)(port->tag == 0x11) * 2);
        }
        if ((((ulong)port & 3) == 0) && (port->tag == 0x11)) {
          psVar2 = (port->value).type.getters;
          if (psVar2 == (sexp)0x0) {
            psVar2 = (port->value).type.slots;
            iVar3 = -1;
            if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x12)) {
              iVar3 = (psVar2->value).promise.donep;
            }
          }
          else {
            iVar3 = fileno((FILE *)psVar2);
          }
          shutdown(iVar3,1);
        }
      }
      if ((port->value).flonum_bits[0x2c] == '\0') {
        ppsVar1 = &(((port->value).type.slots)->value).type.slots;
        *ppsVar1 = (sexp)((long)&(*ppsVar1)[-1].value + 0x60bf);
        if (((*ppsVar1 == (sexp)0x0) &&
            (psVar2 = (port->value).type.slots, (psVar2->value).flonum_bits[0] != '\0')) &&
           ((psVar2->value).flonum_bits[1] == '\0')) {
          (psVar2->value).flonum_bits[0] = '\0';
          close((psVar2->value).promise.donep);
        }
      }
    }
    psVar2 = (port->value).type.getters;
    if ((psVar2 != (sexp)0x0) && ((port->value).flonum_bits[0x2c] == '\0')) {
      fclose((FILE *)psVar2);
    }
    (port->value).type.print = (sexp)0x0;
    (port->value).port.size = 0;
  }
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_finalize_port (sexp ctx, sexp self, sexp_sint_t n, sexp port) {
  sexp res = SEXP_VOID;
  if (sexp_port_openp(port)) {
    sexp_port_openp(port) = 0;
    if (sexp_oportp(port)) sexp_flush_forced(ctx, port);
#ifndef PLAN9
    if (sexp_filenop(sexp_port_fd(port))
        && sexp_fileno_openp(sexp_port_fd(port))) {
      if (sexp_port_shutdownp(port)) {
        /* shutdown the socket if requested */
        if (sexp_iportp(port))
          shutdown(sexp_port_fileno(port), sexp_oportp(port) ? SHUT_RDWR : SHUT_RD);
        if (sexp_oportp(port))
          shutdown(sexp_port_fileno(port), SHUT_WR);
      }
      if (!sexp_port_no_closep(port)) {
        if (--sexp_fileno_count(sexp_port_fd(port)) == 0)
          sexp_finalize_fileno(ctx, self, n, sexp_port_fd(port));
      }
    }
#endif
    if (sexp_port_stream(port) && ! sexp_port_no_closep(port))
      /* close the stream */
      fclose(sexp_port_stream(port));
    sexp_port_offset(port) = 0;
    sexp_port_size(port) = 0;
  }
  return res;
}